

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void __thiscall
rr::RenderTarget::RenderTarget
          (RenderTarget *this,MultisamplePixelBufferAccess *colorMultisampleBuffer,
          MultisamplePixelBufferAccess *depthMultisampleBuffer,
          MultisamplePixelBufferAccess *stencilMultisampleBuffer)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  int iVar3;
  ChannelOrder CVar4;
  ChannelType CVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  PixelBufferAccess PStack_58;
  
  lVar8 = 0;
  do {
    MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
              ((MultisamplePixelBufferAccess *)(&this->field_0x0 + lVar8));
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0xa0);
  this->m_numColorBuffers = 1;
  tcu::getEffectiveDepthStencilAccess(&PStack_58,&depthMultisampleBuffer->m_access,MODE_DEPTH);
  MultisamplePixelBufferAccess::fromMultisampleAccess(&this->m_depthBuffer,&PStack_58);
  tcu::getEffectiveDepthStencilAccess(&PStack_58,&stencilMultisampleBuffer->m_access,MODE_STENCIL);
  MultisamplePixelBufferAccess::fromMultisampleAccess(&this->m_stencilBuffer,&PStack_58);
  *(void **)&this->field_0x20 =
       (colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_data;
  CVar4 = (colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_format.order;
  CVar5 = (colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_format.type;
  iVar6 = (colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0];
  iVar7 = (colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1];
  pCVar1 = &(colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess;
  iVar2 = (pCVar1->m_pitch).m_data[1];
  iVar3 = (pCVar1->m_pitch).m_data[2];
  *(undefined8 *)&this->field_0x10 =
       *(undefined8 *)
        ((colorMultisampleBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data + 2);
  *(int *)&this->field_0x18 = iVar2;
  *(int *)&this->field_0x1c = iVar3;
  *(ChannelOrder *)&this->field_0x0 = CVar4;
  *(ChannelType *)&this->field_0x4 = CVar5;
  *(int *)&this->field_0x8 = iVar6;
  *(int *)&this->field_0xc = iVar7;
  return;
}

Assistant:

RenderTarget::RenderTarget (const MultisamplePixelBufferAccess& colorMultisampleBuffer,
							const MultisamplePixelBufferAccess& depthMultisampleBuffer,
							const MultisamplePixelBufferAccess& stencilMultisampleBuffer)
	: m_numColorBuffers	(1)
	, m_depthBuffer		(MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getEffectiveDepthStencilAccess(depthMultisampleBuffer.raw(), tcu::Sampler::MODE_DEPTH)))
	, m_stencilBuffer	(MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getEffectiveDepthStencilAccess(stencilMultisampleBuffer.raw(), tcu::Sampler::MODE_STENCIL)))
{
	m_colorBuffers[0] = colorMultisampleBuffer;
}